

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

QWidget * __thiscall
QWidgetPrivate::childAtRecursiveHelper
          (QWidgetPrivate *this,QPointF *p,bool ignoreChildrenInDestructor)

{
  undefined4 uVar1;
  undefined4 uVar2;
  QWidget *pQVar3;
  QWidgetData *pQVar4;
  bool bVar5;
  QWidget *pQVar6;
  QWidgetPrivate *d;
  uint uVar7;
  long in_FS_OFFSET;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = *(uint *)&this->field_0x28;
  do {
    do {
      uVar7 = uVar7 - 1;
      pQVar6 = (QWidget *)0x0;
      if ((int)uVar7 < 0) goto LAB_00300957;
      pQVar3 = *(QWidget **)(*(long *)&this->field_0x20 + (ulong)(uVar7 & 0x7fffffff) * 8);
    } while ((((pQVar3 == (QWidget *)0x0) ||
              ((*(byte *)(*(long *)&pQVar3->field_0x8 + 0x30) & 1) == 0)) ||
             (pQVar4 = pQVar3->data,
             ((pQVar4->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) ||
            ((((pQVar4->widget_attributes & 0x10000) != 0 ||
              ((*(byte *)(*(long *)&pQVar3->field_0x8 + 0x242) & 8) != 0)) ||
             ((ignoreChildrenInDestructor && ((pQVar4->field_0x12 & 4) != 0))))));
    uVar1 = (pQVar4->crect).x1;
    uVar2 = (pQVar4->crect).y1;
    local_48.xp = p->xp - (double)(int)uVar1;
    local_48.yp = p->yp - (double)(int)uVar2;
    bVar5 = pointInsideRectAndMask(*(QWidgetPrivate **)&pQVar3->field_0x8,&local_48);
  } while (!bVar5);
  pQVar6 = childAtRecursiveHelper
                     (*(QWidgetPrivate **)&pQVar3->field_0x8,&local_48,ignoreChildrenInDestructor);
  if (pQVar6 == (QWidget *)0x0) {
    pQVar6 = pQVar3;
  }
LAB_00300957:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pQVar6;
}

Assistant:

QWidget *QWidgetPrivate::childAtRecursiveHelper(const QPointF &p, bool ignoreChildrenInDestructor) const
{
    for (int i = children.size() - 1; i >= 0; --i) {
        QWidget *child = qobject_cast<QWidget *>(children.at(i));
        if (!child || child->isWindow() || child->isHidden() || child->testAttribute(Qt::WA_TransparentForMouseEvents)
            || (ignoreChildrenInDestructor && child->data->in_destructor)) {
            continue;
        }

        // Map the point 'p' from parent coordinates to child coordinates.
        QPointF childPoint = p;
        childPoint -= child->data->crect.topLeft();

        // Check if the point hits the child.
        if (!child->d_func()->pointInsideRectAndMask(childPoint))
            continue;

        // Do the same for the child's descendants.
        if (QWidget *w = child->d_func()->childAtRecursiveHelper(childPoint, ignoreChildrenInDestructor))
            return w;

        // We have found our target; namely the child at position 'p'.
        return child;
    }
    return nullptr;
}